

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O0

string * testing::internal::CanonicalizeForStdLibVersioning
                   (string *__return_storage_ptr__,string *s)

{
  int iVar1;
  long lVar2;
  size_type end;
  string *s_local;
  
  iVar1 = std::__cxx11::string::compare((ulong)s,0,(char *)0x7);
  if ((iVar1 == 0) && (lVar2 = std::__cxx11::string::find((char *)s,0x186a54), lVar2 != -1)) {
    std::__cxx11::string::erase((ulong)s,3);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

inline std::string CanonicalizeForStdLibVersioning(std::string s) {
  static const char prefix[] = "std::__";
  if (s.compare(0, strlen(prefix), prefix) == 0) {
    std::string::size_type end = s.find("::", strlen(prefix));
    if (end != s.npos) {
      // Erase everything between the initial `std` and the second `::`.
      s.erase(strlen("std"), end - strlen("std"));
    }
  }
  return s;
}